

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11JsonConfig.cpp
# Opt level: O2

HelicsConfigJSON * helics::addJsonConfig(App *app)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  element_type *peVar3;
  Option *pOVar4;
  allocator<char> local_13a;
  allocator<char> local_139;
  __shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2> local_138;
  shared_ptr<helics::HelicsConfigJSON> fmtr;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  __shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2> local_f8;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  CLI::std::make_shared<helics::HelicsConfigJSON>();
  peVar2 = fmtr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  app->allow_config_extras_ = ignore_all;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"--config_section",(allocator<char> *)&local_138);
  peVar3 = fmtr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"specify the section of the config file to use",&local_13a);
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (app,&local_40,&(peVar3->super_ConfigBase).configSection,&local_60);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  pOVar4->trigger_on_result_ = true;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"--config_index",(allocator<char> *)&local_138);
  peVar3 = fmtr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "specify the section index of the config file to use for configuration arrays",
             &local_13a);
  pOVar4 = CLI::App::add_option<short,_short,_(CLI::detail::enabler)0>
                     (app,&local_80,&(peVar3->super_ConfigBase).configIndex,&local_a0);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  pOVar4->trigger_on_result_ = true;
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  pOVar4 = app->config_ptr_;
  CLI::std::__shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_138,
             &fmtr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>);
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_118._M_unused._M_object = operator_new(0x10);
  _Var1._M_pi = local_138._M_refcount._M_pi;
  local_138._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)local_118._M_unused._0_8_ = local_138._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_118._M_unused._0_8_ + 8) =
       _Var1._M_pi;
  local_138._M_ptr = (element_type *)0x0;
  pcStack_100 = CLI::std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/helicsCLI11JsonConfig.cpp:135:34)>
                ::_M_invoke;
  local_108 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/helicsCLI11JsonConfig.cpp:135:34)>
              ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_13a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_139);
  CLI::Option::check(pOVar4,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)&local_118,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138._M_refcount);
  local_f8._M_ptr =
       (element_type *)
       fmtr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f8._M_refcount._M_pi =
       fmtr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  fmtr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  fmtr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CLI::std::__shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(app->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>,
             &local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &fmtr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return peVar2;
}

Assistant:

HelicsConfigJSON* addJsonConfig(CLI::App* app)
{
    auto fmtr = std::make_shared<HelicsConfigJSON>();
    auto* fmtrRet = fmtr.get();
    app->allow_config_extras(CLI::config_extras_mode::ignore_all);
    app->add_option("--config_section",
                    fmtr->sectionRef(),
                    "specify the section of the config file to use")
        ->configurable(false)
        ->trigger_on_parse();
    app->add_option("--config_index",
                    fmtr->indexRef(),
                    "specify the section index of the config file to use for configuration arrays")
        ->configurable(false)
        ->trigger_on_parse();
    app->get_config_ptr()->check([fmtr](const std::string& filename) {
        if (CLI::ExistingFile(filename).empty()) {
            fmtr->skipJson(!fileops::hasJsonExtension(filename));
        }
        return std::string{};
    });

    app->config_formatter(std::move(fmtr));
    return fmtrRet;
}